

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceCacheVk.cpp
# Opt level: O2

bool Diligent::IsDynamicBuffer(Resource *Res)

{
  DescriptorType DVar1;
  BufferViewVkImpl *this;
  BufferVkImpl *pBVar2;
  uint uVar3;
  string msg;
  string local_30;
  
  if ((Res->pObject).m_pObject != (IDeviceObject *)0x0) {
    uVar3 = Res->Type - 9;
    if (uVar3 < 4) {
      this = RefCntAutoPtr<Diligent::IDeviceObject>::ConstPtr<Diligent::BufferViewVkImpl>
                       (&Res->pObject);
      pBVar2 = BufferViewBase<Diligent::EngineVkImplTraits>::GetBuffer<Diligent::BufferVkImpl_const>
                         (&this->super_BufferViewBase<Diligent::EngineVkImplTraits>);
    }
    else {
      if (1 < Res->Type - 7) {
        if (Res->BufferRangeSize == 0) {
          return false;
        }
        FormatString<char[26],char[25]>
                  (&local_30,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"Res.BufferRangeSize == 0",(char (*) [25])(ulong)uVar3);
        DebugAssertionFailed
                  (local_30._M_dataplus._M_p,"IsDynamicBuffer",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderResourceCacheVk.cpp"
                   ,0x8f);
        std::__cxx11::string::~string((string *)&local_30);
        return false;
      }
      pBVar2 = RefCntAutoPtr<Diligent::IDeviceObject>::ConstPtr<Diligent::BufferVkImpl>
                         (&Res->pObject);
    }
    if (pBVar2 != (BufferVkImpl *)0x0) {
      DVar1 = Res->Type;
      if ((pBVar2->super_BufferBase<Diligent::EngineVkImplTraits>).
          super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
          .m_Desc.Usage != USAGE_DYNAMIC) {
        if (0xc < DVar1) {
          return false;
        }
        if ((0x1900U >> (DVar1 & 0x1f) & 1) == 0) {
          return false;
        }
        if (Res->BufferRangeSize == 0) {
          return false;
        }
        if ((pBVar2->super_BufferBase<Diligent::EngineVkImplTraits>).
            super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
            .m_Desc.Size <= Res->BufferRangeSize) {
          return false;
        }
      }
      if ((DVar1 < 0xd) && ((0x1900U >> (DVar1 & 0x1f) & 1) != 0)) {
        return true;
      }
      FormatString<char[63]>
                (&local_30,
                 (char (*) [63])"Dynamic buffers must only be used with dynamic descriptor type");
      DebugAssertionFailed
                (local_30._M_dataplus._M_p,"IsDynamicBuffer",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderResourceCacheVk.cpp"
                 ,0xa1);
      std::__cxx11::string::~string((string *)&local_30);
      return true;
    }
  }
  return false;
}

Assistant:

void ShaderResourceCacheVk::Resource::SetUniformBuffer(RefCntAutoPtr<IDeviceObject>&& _pBuffer, Uint64 _BaseOffset, Uint64 _RangeSize)
{
    VERIFY_EXPR(Type == DescriptorType::UniformBuffer ||
                Type == DescriptorType::UniformBufferDynamic);

    pObject = std::move(_pBuffer);

    const BufferVkImpl* pBuffVk = pObject.ConstPtr<BufferVkImpl>();

#ifdef DILIGENT_DEBUG
    if (pBuffVk != nullptr)
    {
        // VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER or VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER_DYNAMIC descriptor type require
        // buffer to be created with VK_BUFFER_USAGE_UNIFORM_BUFFER_BIT
        VERIFY_EXPR((pBuffVk->GetDesc().BindFlags & BIND_UNIFORM_BUFFER) != 0);
        VERIFY(Type == DescriptorType::UniformBufferDynamic || pBuffVk->GetDesc().Usage != USAGE_DYNAMIC,
               "Dynamic buffer must be used with UniformBufferDynamic descriptor");
    }
#endif

    VERIFY(_BaseOffset + _RangeSize <= (pBuffVk != nullptr ? pBuffVk->GetDesc().Size : 0), "Specified range is out of buffer bounds");
    BufferBaseOffset = _BaseOffset;
    BufferRangeSize  = _RangeSize;
    if (BufferRangeSize == 0)
        BufferRangeSize = pBuffVk != nullptr ? (pBuffVk->GetDesc().Size - BufferBaseOffset) : 0;

    // Reset dynamic offset
    BufferDynamicOffset = 0;
}